

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_message.cpp
# Opt level: O1

string * same_s(string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  pcVar2 = (s->_M_dataplus)._M_p;
  paVar1 = &s->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&s->field_2 + 8);
    (in_RDI->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = uVar3;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = pcVar2;
    (in_RDI->field_2)._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  in_RDI->_M_string_length = s->_M_string_length;
  (s->_M_dataplus)._M_p = (pointer)paVar1;
  s->_M_string_length = 0;
  (s->field_2)._M_local_buf[0] = '\0';
  return in_RDI;
}

Assistant:

std::string same_s(std::string s)
{
    return s;
}